

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTetrahedronShape.cpp
# Opt level: O0

void __thiscall
btBU_Simplex1to4::getAabb
          (btBU_Simplex1to4 *this,btTransform *t,btVector3 *aabbMin,btVector3 *aabbMax)

{
  btVector3 *in_RDI;
  btVector3 *unaff_retaddr;
  
  btPolyhedralConvexAabbCachingShape::getAabb
            ((btPolyhedralConvexAabbCachingShape *)aabbMin,(btTransform *)aabbMax,unaff_retaddr,
             in_RDI);
  return;
}

Assistant:

void btBU_Simplex1to4::getAabb(const btTransform& t,btVector3& aabbMin,btVector3& aabbMax) const
{
#if 1
	btPolyhedralConvexAabbCachingShape::getAabb(t,aabbMin,aabbMax);
#else
	aabbMin.setValue(BT_LARGE_FLOAT,BT_LARGE_FLOAT,BT_LARGE_FLOAT);
	aabbMax.setValue(-BT_LARGE_FLOAT,-BT_LARGE_FLOAT,-BT_LARGE_FLOAT);

	//just transform the vertices in worldspace, and take their AABB
	for (int i=0;i<m_numVertices;i++)
	{
		btVector3 worldVertex = t(m_vertices[i]);
		aabbMin.setMin(worldVertex);
		aabbMax.setMax(worldVertex);
	}
#endif
}